

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_stm(DisasContext_conflict13 *s,DisasOps *o)

{
  int iVar1;
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 arg;
  TCGv_i64 addr;
  uint uVar2;
  uint uVar3;
  int mem_index;
  TCGv_i64 arg2;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = get_field1(s,FLD_O_r1,FLD_C_b1);
  uVar3 = get_field1(s,FLD_O_r3,FLD_C_i3);
  iVar1 = (int)s->insn->data;
  arg2 = tcg_const_i64_s390x(tcg_ctx,(long)iVar1);
  while( true ) {
    arg = tcg_ctx->regs[(int)uVar2];
    addr = o->in2;
    mem_index = get_mem_index(s);
    if (iVar1 == 8) {
      tcg_gen_qemu_st64(tcg_ctx,arg,addr,mem_index);
    }
    else {
      tcg_gen_qemu_st32(tcg_ctx,arg,addr,mem_index);
    }
    if (uVar2 == uVar3) break;
    tcg_gen_add_i64(tcg_ctx,o->in2,o->in2,arg2);
    uVar2 = uVar2 + 1 & 0xf;
  }
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_stm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    int size = s->insn->data;
    TCGv_i64 tsize = tcg_const_i64(tcg_ctx, size);

    while (1) {
        if (size == 8) {
            tcg_gen_qemu_st64(tcg_ctx, tcg_ctx->regs[r1], o->in2, get_mem_index(s));
        } else {
            tcg_gen_qemu_st32(tcg_ctx, tcg_ctx->regs[r1], o->in2, get_mem_index(s));
        }
        if (r1 == r3) {
            break;
        }
        tcg_gen_add_i64(tcg_ctx, o->in2, o->in2, tsize);
        r1 = (r1 + 1) & 15;
    }

    tcg_temp_free_i64(tcg_ctx, tsize);
    return DISAS_NEXT;
}